

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

bool __thiscall OpenMD::ZConstraintForceModifier::checkZConsState(ZConstraintForceModifier *this)

{
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *__position;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *__position_00;
  _List_node_base *p_Var1;
  RealType RVar2;
  bool bVar3;
  _Self __tmp;
  const_iterator cVar4;
  _Self __tmp_1;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> newFixedZMols;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> newMovingZMols;
  Vector<double,_3U> local_98;
  Vector3d d_1;
  Vector<double,_3U> local_68;
  Vector3d com;
  
  Vector<double,_3U>::Vector(&com.super_Vector<double,_3U>);
  newMovingZMols.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&newMovingZMols;
  newMovingZMols.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
  _M_impl._M_node._M_size = 0;
  __position = &this->fixedZMols_;
  bVar3 = false;
  cVar4._M_node =
       (this->fixedZMols_).
       super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  newMovingZMols.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       newMovingZMols.
       super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  while (cVar4._M_node != (_List_node_base *)__position) {
    Molecule::getCom((Vector3d *)&newFixedZMols,(Molecule *)cVar4._M_node[1]._M_next);
    Vector<double,_3U>::operator=
              (&com.super_Vector<double,_3U>,(Vector<double,_3U> *)&newFixedZMols);
    p_Var1 = cVar4._M_node[1]._M_prev;
    Vector<double,_3U>::Vector(&local_98);
    local_98.data_[0] = 0.0;
    local_98.data_[1] = 0.0;
    local_98.data_[2] = (double)p_Var1;
    operator-(&d_1.super_Vector<double,_3U>,&com.super_Vector<double,_3U>,&local_98);
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&newFixedZMols,&d_1.super_Vector<double,_3U>);
    Snapshot::wrapVector(this->currSnapshot_,(Vector3d *)&newFixedZMols);
    if (ABS((double)newFixedZMols.
                    super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>
                    ._M_impl._M_node._M_size) < this->zconsTol_ ||
        ABS((double)newFixedZMols.
                    super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>
                    ._M_impl._M_node._M_size) == this->zconsTol_) {
      cVar4._M_node = (cVar4._M_node)->_M_next;
    }
    else {
      if (this->usingZconsGap_ == true) {
        cVar4._M_node[4]._M_prev = (_List_node_base *)this->infiniteTime;
      }
      p_Var1 = (cVar4._M_node)->_M_next;
      std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::push_back
                (&newMovingZMols,(value_type *)(cVar4._M_node + 1));
      std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::erase
                (__position,cVar4);
      bVar3 = true;
      cVar4._M_node = p_Var1;
    }
  }
  newFixedZMols.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
  _M_impl._M_node._M_size = 0;
  __position_00 = &this->movingZMols_;
  cVar4._M_node =
       (this->movingZMols_).
       super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  newFixedZMols.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&newFixedZMols;
  newFixedZMols.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&newFixedZMols;
  while (cVar4._M_node != (_List_node_base *)__position_00) {
    Molecule::getCom((Vector3d *)&d_1.super_Vector<double,_3U>,(Molecule *)cVar4._M_node[1]._M_next)
    ;
    Vector<double,_3U>::operator=(&com.super_Vector<double,_3U>,&d_1.super_Vector<double,_3U>);
    p_Var1 = cVar4._M_node[1]._M_prev;
    Vector<double,_3U>::Vector(&local_68);
    local_68.data_[0] = 0.0;
    local_68.data_[1] = 0.0;
    local_68.data_[2] = (double)p_Var1;
    operator-(&local_98,&com.super_Vector<double,_3U>,&local_68);
    Vector<double,_3U>::Vector(&d_1.super_Vector<double,_3U>,&local_98);
    Snapshot::wrapVector(this->currSnapshot_,(Vector3d *)&d_1.super_Vector<double,_3U>);
    if (ABS(d_1.super_Vector<double,_3U>.data_[2]) <= this->zconsTol_) {
      if (this->usingZconsGap_ == true) {
        RVar2 = Snapshot::getTime(this->currSnapshot_);
        cVar4._M_node[4]._M_prev = (_List_node_base *)(RVar2 + this->zconsFixingTime_);
      }
      p_Var1 = (cVar4._M_node)->_M_next;
      std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::push_back
                (&newFixedZMols,(value_type *)(cVar4._M_node + 1));
      std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::erase
                (__position_00,cVar4);
      bVar3 = true;
      cVar4._M_node = p_Var1;
    }
    else {
      cVar4._M_node = (cVar4._M_node)->_M_next;
    }
  }
  std::__cxx11::list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>>::
  insert<std::_List_iterator<OpenMD::ZconstraintMol>,void>
            ((list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>> *)__position,
             (const_iterator)__position,
             (_List_iterator<OpenMD::ZconstraintMol>)
             newFixedZMols.
             super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
             _M_impl._M_node.super__List_node_base._M_next,(_List_node_base *)&newFixedZMols);
  std::__cxx11::list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>>::
  insert<std::_List_iterator<OpenMD::ZconstraintMol>,void>
            ((list<OpenMD::ZconstraintMol,std::allocator<OpenMD::ZconstraintMol>> *)__position_00,
             (const_iterator)__position_00,
             (_List_iterator<OpenMD::ZconstraintMol>)
             newMovingZMols.
             super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
             _M_impl._M_node.super__List_node_base._M_next,(_List_node_base *)&newMovingZMols);
  std::__cxx11::_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
  _M_clear(&newFixedZMols.
            super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>);
  std::__cxx11::_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
  _M_clear(&newMovingZMols.
            super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>);
  return bVar3;
}

Assistant:

bool ZConstraintForceModifier::checkZConsState() {
    Vector3d com;
    RealType diff;
    int changed = 0;

    std::list<ZconstraintMol>::iterator i;
    std::list<ZconstraintMol>::iterator j;

    std::list<ZconstraintMol> newMovingZMols;
    for (i = fixedZMols_.begin(); i != fixedZMols_.end();) {
      com        = i->mol->getCom();
      Vector3d d = com - Vector3d(0.0, 0.0, i->param.zTargetPos);
      currSnapshot_->wrapVector(d);

      RealType diff = fabs(d[whichDirection]);

      if (diff > zconsTol_) {
        if (usingZconsGap_) { i->endFixingTime = infiniteTime; }
        j = i++;
        newMovingZMols.push_back(*j);
        fixedZMols_.erase(j);
        changed = 1;
      } else {
        ++i;
      }
    }

    std::list<ZconstraintMol> newFixedZMols;
    for (i = movingZMols_.begin(); i != movingZMols_.end();) {
      com        = i->mol->getCom();
      Vector3d d = com - Vector3d(0.0, 0.0, i->param.zTargetPos);
      currSnapshot_->wrapVector(d);
      diff = fabs(d[whichDirection]);

      if (diff <= zconsTol_) {
        if (usingZconsGap_) {
          i->endFixingTime = currSnapshot_->getTime() + zconsFixingTime_;
        }
        // This moving zconstraint molecule is now fixed
        j = i++;
        newFixedZMols.push_back(*j);
        movingZMols_.erase(j);
        changed = 1;
      } else {
        ++i;
      }
    }

    // merge the lists
    fixedZMols_.insert(fixedZMols_.end(), newFixedZMols.begin(),
                       newFixedZMols.end());
    movingZMols_.insert(movingZMols_.end(), newMovingZMols.begin(),
                        newMovingZMols.end());

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &changed, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
#endif

    return (changed > 0);
  }